

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::PageEncodingStats::printTo(PageEncodingStats *this,ostream *out)

{
  ostream *poVar1;
  type *val;
  type *val_00;
  string local_40;
  
  std::operator<<(out,"PageEncodingStats(");
  poVar1 = std::operator<<(out,"page_type=");
  to_string_abi_cxx11_(&local_40,(duckdb_parquet *)&this->page_type,val);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"encoding=");
  to_string_abi_cxx11_(&local_40,(duckdb_parquet *)&this->encoding,val_00);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"count=");
  duckdb_apache::thrift::to_string<int>(&local_40,&this->count);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator<<(out,")");
  return;
}

Assistant:

void PageEncodingStats::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "PageEncodingStats(";
  out << "page_type=" << to_string(page_type);
  out << ", " << "encoding=" << to_string(encoding);
  out << ", " << "count=" << to_string(count);
  out << ")";
}